

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LowerLdSlot(Lowerer *this,Instr *instr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  Opnd *opnd;
  undefined4 *puVar4;
  Opnd *this_00;
  
  opnd = IR::Instr::UnlinkSrc1(instr);
  if (opnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b91,"(srcOpnd)","Expected src opnd on LdSlot");
    if (!bVar2) goto LAB_005bf279;
    *puVar4 = 0;
  }
  this_00 = CreateOpndForSlotAccess(this,opnd);
  IR::Opnd::Free(opnd,this->m_func);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_005bf279;
    *puVar4 = 0;
  }
  func = instr->m_func;
  if (this_00->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_005bf279:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = this_00->field_0xb;
  if ((bVar3 & 2) != 0) {
    this_00 = IR::Opnd::Copy(this_00,func);
    bVar3 = this_00->field_0xb;
  }
  this_00->field_0xb = bVar3 | 2;
  instr->m_src1 = this_00;
  LowererMD::ChangeToAssign(instr);
  return;
}

Assistant:

void
Lowerer::LowerLdSlot(IR::Instr *instr)
{
    IR::Opnd * srcOpnd = instr->UnlinkSrc1();
    AssertMsg(srcOpnd, "Expected src opnd on LdSlot");
    IR::Opnd * srcNew = this->CreateOpndForSlotAccess(srcOpnd);
    srcOpnd->Free(this->m_func);

    instr->SetSrc1(srcNew);
        m_lowererMD.ChangeToAssign(instr);
    }